

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3TwoPartName(Parse *pParse,Token *pName1,Token *pName2,Token **pUnqual)

{
  sqlite3 *db;
  uint uVar1;
  int iVar2;
  
  db = pParse->db;
  if (pName2->n == 0) {
    uVar1 = (uint)(db->init).iDb;
    *pUnqual = pName1;
  }
  else {
    if ((db->init).busy == '\0') {
      *pUnqual = pName2;
      iVar2 = sqlite3FindDb(db,pName1);
      if (-1 < iVar2) {
        return iVar2;
      }
      sqlite3ErrorMsg(pParse,"unknown database %T",pName1);
    }
    else {
      sqlite3ErrorMsg(pParse,"corrupt database");
    }
    uVar1 = 0xffffffff;
  }
  return uVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3TwoPartName(
  Parse *pParse,      /* Parsing and code generating context */
  Token *pName1,      /* The "xxx" in the name "xxx.yyy" or "xxx" */
  Token *pName2,      /* The "yyy" in the name "xxx.yyy" */
  Token **pUnqual     /* Write the unqualified object name here */
){
  int iDb;                    /* Database holding the object */
  sqlite3 *db = pParse->db;

  assert( pName2!=0 );
  if( pName2->n>0 ){
    if( db->init.busy ) {
      sqlite3ErrorMsg(pParse, "corrupt database");
      return -1;
    }
    *pUnqual = pName2;
    iDb = sqlite3FindDb(db, pName1);
    if( iDb<0 ){
      sqlite3ErrorMsg(pParse, "unknown database %T", pName1);
      return -1;
    }
  }else{
    assert( db->init.iDb==0 || db->init.busy || IN_SPECIAL_PARSE
             || (db->mDbFlags & DBFLAG_Vacuum)!=0);
    iDb = db->init.iDb;
    *pUnqual = pName1;
  }
  return iDb;
}